

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_PackFontRangesGatherRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  int glyph_00;
  int local_68;
  float local_64;
  int glyph;
  int codepoint;
  int y1;
  int x1;
  int y0;
  int x0;
  float scale;
  float fh;
  int missing_glyph_added;
  int k;
  int j;
  int i;
  stbrp_rect *rects_local;
  stbtt_pack_range *psStack_20;
  int num_ranges_local;
  stbtt_pack_range *ranges_local;
  stbtt_fontinfo *info_local;
  stbtt_pack_context *spc_local;
  
  scale = 0.0;
  fh = 0.0;
  _j = rects;
  rects_local._4_4_ = num_ranges;
  psStack_20 = ranges;
  ranges_local = (stbtt_pack_range *)info;
  info_local = (stbtt_fontinfo *)spc;
  for (k = 0; k < rects_local._4_4_; k = k + 1) {
    x0 = (int)psStack_20[k].font_size;
    if ((float)x0 <= 0.0) {
      local_64 = stbtt_ScaleForMappingEmToPixels((stbtt_fontinfo *)ranges_local,-(float)x0);
    }
    else {
      local_64 = stbtt_ScaleForPixelHeight((stbtt_fontinfo *)ranges_local,(float)x0);
    }
    y0 = (int)local_64;
    psStack_20[k].h_oversample = (uchar)info_local->hhea;
    psStack_20[k].v_oversample = (uchar)info_local->hmtx;
    for (missing_glyph_added = 0; missing_glyph_added < psStack_20[k].num_chars;
        missing_glyph_added = missing_glyph_added + 1) {
      if (psStack_20[k].array_of_unicode_codepoints == (int *)0x0) {
        local_68 = psStack_20[k].first_unicode_codepoint_in_range + missing_glyph_added;
      }
      else {
        local_68 = psStack_20[k].array_of_unicode_codepoints[missing_glyph_added];
      }
      glyph_00 = stbtt_FindGlyphIndex((stbtt_fontinfo *)ranges_local,local_68);
      if ((glyph_00 == 0) && ((info_local->glyf != 0 || (scale != 0.0)))) {
        _j[(int)fh].h = 0;
        _j[(int)fh].w = 0;
      }
      else {
        stbtt_GetGlyphBitmapBoxSubpixel
                  ((stbtt_fontinfo *)ranges_local,glyph_00,(float)y0 * (float)(uint)info_local->hhea
                   ,(float)y0 * (float)(uint)info_local->hmtx,0.0,0.0,&x1,&y1,&codepoint,&glyph);
        _j[(int)fh].w = (codepoint - x1) + info_local->head + info_local->hhea + -1;
        _j[(int)fh].h = (glyph - y1) + info_local->head + info_local->hmtx + -1;
        if (glyph_00 == 0) {
          scale = 1.4013e-45;
        }
      }
      fh = (float)((int)fh + 1);
    }
  }
  return (int)fh;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesGatherRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k;
   int missing_glyph_added = 0;

   k=0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      ranges[i].h_oversample = (unsigned char) spc->h_oversample;
      ranges[i].v_oversample = (unsigned char) spc->v_oversample;
      for (j=0; j < ranges[i].num_chars; ++j) {
         int x0,y0,x1,y1;
         int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
         int glyph = stbtt_FindGlyphIndex(info, codepoint);
         if (glyph == 0 && (spc->skip_missing || missing_glyph_added)) {
            rects[k].w = rects[k].h = 0;
         } else {
            stbtt_GetGlyphBitmapBoxSubpixel(info,glyph,
                                            scale * spc->h_oversample,
                                            scale * spc->v_oversample,
                                            0,0,
                                            &x0,&y0,&x1,&y1);
            rects[k].w = (stbrp_coord) (x1-x0 + spc->padding + spc->h_oversample-1);
            rects[k].h = (stbrp_coord) (y1-y0 + spc->padding + spc->v_oversample-1);
            if (glyph == 0)
               missing_glyph_added = 1;
         }
         ++k;
      }
   }

   return k;
}